

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

DAngle __thiscall UDMFParserBase::CheckAngle(UDMFParserBase *this,char *key)

{
  char *pcVar1;
  
  if ((*(uint *)(key + 0xc) | 2) != 0x106) {
    FScanner::ScriptMessage((FScanner *)key,"Floating point value expected for key \'%s\'");
  }
  pcVar1 = (char *)((double)((ulong)(*(double *)(key + 0x18) * 11930464.711111112 +
                                    6755399441055744.0) & 0xffffffff) * 8.381903171539307e-08);
  (this->sc).String = pcVar1;
  return (DAngle)(double)pcVar1;
}

Assistant:

DAngle UDMFParserBase::CheckAngle(const char *key)
{
	return DAngle(CheckFloat(key)).Normalized360();
}